

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O2

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>::
ContKRMmatricesLoad(ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                    *this,double Kfactor,double Rfactor)

{
  double local_78;
  double local_70;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_68;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>> local_40 [40]
  ;
  
  if (this->m_Jac != (ChContactJacobian *)0x0) {
    local_78 = Rfactor;
    local_70 = Kfactor;
    ChKblockGeneric::Get_K((ChMatrixRef *)&local_68,&this->m_Jac->m_KRM);
    Eigen::
    DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
    setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             *)&local_68);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
              (&local_68,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->m_Jac->m_K,
               &local_70);
    ChKblockGeneric::Get_K((ChMatrixRef *)local_40,&this->m_Jac->m_KRM);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
    operator+=(local_40,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                         *)&local_68);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
              (&local_68,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->m_Jac->m_R,
               &local_78);
    ChKblockGeneric::Get_K((ChMatrixRef *)local_40,&this->m_Jac->m_KRM);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
    operator+=(local_40,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                         *)&local_68);
  }
  return;
}

Assistant:

virtual void ContKRMmatricesLoad(double Kfactor, double Rfactor) override {
        if (m_Jac) {
            m_Jac->m_KRM.Get_K().setZero();

            m_Jac->m_KRM.Get_K() += m_Jac->m_K * Kfactor;
            m_Jac->m_KRM.Get_K() += m_Jac->m_R * Rfactor;
        }
    }